

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plastic.hpp
# Opt level: O0

Color __thiscall PlasticBSDF::f(PlasticBSDF *this,Color *albedo,vec3f *wo,vec3f *wi)

{
  Color CVar1;
  long in_RCX;
  long in_RDI;
  float fVar2;
  vec3f vVar3;
  float ratio2;
  float cost;
  float sint;
  float energy;
  undefined8 in_stack_fffffffffffffea0;
  vec3f *this_00;
  undefined4 in_stack_fffffffffffffeb0;
  float p;
  vec3f local_120;
  undefined8 local_110;
  float local_108;
  undefined8 local_100;
  float local_f8;
  undefined8 local_e0;
  float local_d8;
  undefined8 local_d0;
  float local_c8;
  vec3f local_a4;
  undefined8 local_98;
  float local_90;
  vec3f local_8c;
  undefined8 local_80;
  float local_78;
  undefined8 local_70;
  float local_68;
  undefined8 local_60;
  float local_58;
  undefined8 local_50;
  float local_48;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  long local_30;
  vec3f local_c;
  
  local_34 = 1.0;
  local_30 = in_RCX;
  fVar2 = DielectricBRDF::reflectivity
                    ((float)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                     (float)in_stack_fffffffffffffea0);
  local_34 = (1.0 - fVar2) * local_34;
  local_38 = sqrtf(-*(float *)(local_30 + 8) * *(float *)(local_30 + 8) + 1.0);
  local_38 = local_38 / *(float *)(in_RDI + 0x24);
  if (local_38 < 1.0) {
    p = 1.0;
    local_3c = sqrtf(1.0 - local_38 * local_38);
    fVar2 = DielectricBRDF::reflectivity
                      ((float)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                       (float)in_stack_fffffffffffffea0);
    local_34 = local_34 * (p - fVar2);
    local_40 = p / (*(float *)(in_RDI + 0x24) * *(float *)(in_RDI + 0x24));
    this_00 = &local_8c;
    vec3f::vec3f(this_00,local_34);
    vec3f::vec3f(&local_a4,p);
    ::operator*((vec3f *)CONCAT44(p,in_stack_fffffffffffffeb0),(float)((ulong)this_00 >> 0x20));
    vVar3 = ::operator-((vec3f *)CONCAT44(p,in_stack_fffffffffffffeb0),this_00);
    local_c8 = vVar3.z;
    local_90 = local_c8;
    local_d0 = vVar3._0_8_;
    local_98 = local_d0;
    vVar3 = operator/((vec3f *)CONCAT44(p,in_stack_fffffffffffffeb0),this_00);
    local_d8 = vVar3.z;
    local_78 = local_d8;
    local_e0 = vVar3._0_8_;
    local_80 = local_e0;
    vVar3 = ::operator*((vec3f *)CONCAT44(p,in_stack_fffffffffffffeb0),
                        (float)((ulong)this_00 >> 0x20));
    local_68 = vVar3.z;
    local_70 = vVar3._0_8_;
    vVar3 = ::operator*((vec3f *)CONCAT44(p,in_stack_fffffffffffffeb0),
                        (float)((ulong)this_00 >> 0x20));
    local_f8 = vVar3.z;
    local_58 = local_f8;
    local_100 = vVar3._0_8_;
    local_60 = local_100;
    vVar3 = operator/((vec3f *)CONCAT44(p,in_stack_fffffffffffffeb0),(float)((ulong)this_00 >> 0x20)
                     );
    local_108 = vVar3.z;
    local_48 = local_108;
    local_110 = vVar3._0_8_;
    local_50 = local_110;
    vVar3 = ::operator*((vec3f *)CONCAT44(p,in_stack_fffffffffffffeb0),this_00);
    local_120._0_8_ = vVar3._0_8_;
    local_c.x = local_120.x;
    local_c.y = local_120.y;
    local_120.z = vVar3.z;
    local_c.z = local_120.z;
  }
  else {
    vec3f::vec3f(&local_c,0.0);
  }
  CVar1.z = local_c.z;
  CVar1.x = local_c.x;
  CVar1.y = local_c.y;
  return CVar1;
}

Assistant:

Color f(const Color& albedo, const vec3f& wo, const vec3f& wi) const
	{
		// non-Dirac component only
		float energy = 1;
		energy *= 1 - DielectricBRDF::reflectivity(fabs(wo.z), IOR);
		float sint = sqrtf(1-wi.z*wi.z)/IOR;
		if (sint >= 1) return 0; // total reflect (shouldn't happen if IOR>1)
		float cost = sqrtf(1-sint*sint);
		energy *= 1 - DielectricBRDF::reflectivity(cost, 1/IOR);
		float ratio2 = 1/(IOR*IOR); // see note_refract_radiance
		return energy / (1 - albedo * (1-outRatio)) * ratio2 * 1/PI * albedo;
	}